

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::find_position<std::pair<int,int>>
          (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,pair<int,_int> *key)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  
  iVar2 = key->first;
  *(int *)(this + 4) = *(int *)(this + 4) + 1;
  uVar3 = *(long *)(this + 0x60) - 1U & (long)iVar2;
  iVar4 = *(int *)(this + 0x38);
  iVar6 = *(int *)(*(long *)(this + 0x78) + uVar3 * 8);
  iVar1 = iVar4 + 1;
  if (*(int *)(this + 0x44) == iVar6) {
    uVar7 = 0xffffffffffffffff;
    uVar5 = uVar3;
    iVar4 = iVar1;
LAB_0065affd:
    *(int *)(this + 0x38) = iVar4;
  }
  else {
    uVar7 = 0xffffffffffffffff;
    lVar8 = 1;
    do {
      if ((*(long *)(this + 0x50) == 0) ||
         (iVar4 = iVar4 + 2, iVar1 = iVar4, *(int *)(this + 0x3c) != iVar6)) {
        iVar4 = iVar1 + 1;
        if (iVar2 == iVar6) {
          uVar5 = 0xffffffffffffffff;
          uVar7 = uVar3;
          goto LAB_0065affd;
        }
      }
      else if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar3;
      }
      uVar3 = uVar3 + lVar8 & *(long *)(this + 0x60) - 1U;
      iVar6 = *(int *)(*(long *)(this + 0x78) + uVar3 * 8);
      iVar1 = iVar4 + 1;
      lVar8 = lVar8 + 1;
    } while (*(int *)(this + 0x44) != iVar6);
    *(int *)(this + 0x38) = iVar1;
    uVar5 = uVar3;
    if (uVar7 != 0xffffffffffffffff) {
      uVar5 = uVar7;
    }
    uVar7 = 0xffffffffffffffff;
  }
  pVar9.second = uVar5;
  pVar9.first = uVar7;
  return pVar9;
}

Assistant:

size_type bucket_count() const { return num_buckets; }